

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O3

monst * clone_mon(monst *mon,xchar x,xchar y)

{
  xchar x_00;
  xchar y_00;
  uint uVar1;
  level *plVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  boolean bVar6;
  schar sVar7;
  int iVar8;
  uint uVar9;
  undefined8 in_RAX;
  monst *mon_00;
  char *pcVar10;
  monst *pmVar11;
  monst *mtmp2;
  uint uVar12;
  long lVar13;
  schar sVar14;
  int iVar15;
  permonst *ppVar16;
  monst *pmVar17;
  byte bVar18;
  coord mm;
  undefined8 uStack_38;
  
  bVar18 = 0;
  if (mon->mhp < 2) {
    return (monst *)0x0;
  }
  uStack_38 = in_RAX;
  iVar8 = monsndx(mon->data);
  if ((mvitals[iVar8].mvflags & 1) != 0) {
    return (monst *)0x0;
  }
  if (x == '\0') {
    x = mon->mx;
    y = mon->my;
    uStack_38 = CONCAT17(y,CONCAT16(x,(undefined6)uStack_38));
    ppVar16 = mon->data;
LAB_001bbc93:
    bVar6 = enexto((coord *)((long)&uStack_38 + 6),level,x,y,ppVar16);
    if (bVar6 == '\0') {
      return (monst *)0x0;
    }
    pmVar11 = level->monsters[uStack_38._6_1_][uStack_38._7_1_];
    y = uStack_38._7_1_;
    x = uStack_38._6_1_;
    if ((pmVar11 != (monst *)0x0) && ((pmVar11->field_0x61 & 2) == 0)) {
      return (monst *)0x0;
    }
  }
  else {
    if (0x14 < (byte)y || 0x4f < (byte)x) {
      return (monst *)0x0;
    }
    uStack_38 = CONCAT17(y,CONCAT16(x,(undefined6)uStack_38));
    pmVar11 = level->monsters[(byte)x][(byte)y];
    if ((pmVar11 != (monst *)0x0) && ((pmVar11->field_0x61 & 2) == 0)) {
      ppVar16 = mon->data;
      goto LAB_001bbc93;
    }
  }
  plVar2 = level;
  mon_00 = (monst *)calloc(1,0x78);
  pmVar11 = mon;
  pmVar17 = mon_00;
  for (lVar13 = 0xf; lVar13 != 0; lVar13 = lVar13 + -1) {
    pmVar17->nmon = pmVar11->nmon;
    pmVar11 = (monst *)((long)pmVar11 + (ulong)bVar18 * -0x10 + 8);
    pmVar17 = (monst *)((long)pmVar17 + (ulong)bVar18 * -0x10 + 8);
  }
  mon_00->nmon = plVar2->monlist;
  plVar2->monlist = mon_00;
  uVar1 = flags.ident;
  uVar9 = flags.ident + 1;
  uVar12 = uVar9;
  mon_00->m_id = flags.ident;
  flags.ident = uVar12;
  if (uVar1 == 0) {
    flags.ident = 2;
    mon_00->m_id = uVar9;
  }
  mon_00->mx = x;
  mon_00->my = y;
  mon_00->minvent = (obj *)0x0;
  uVar9 = *(uint *)&mon_00->field_0x60;
  uVar12 = uVar9 & 0xfeffffff;
  *(uint *)&mon_00->field_0x60 = uVar12;
  mon_00->mhpmax = mon->mhpmax;
  iVar8 = mon->mhp;
  iVar15 = iVar8 / 2;
  mon_00->mhp = iVar15;
  mon->mhp = iVar8 - iVar15;
  uVar1 = *(uint *)&mon->field_0x60;
  if ((uVar1 & 0x1a000000) != 0) {
    uVar9 = uVar9 & 0xfcffffff;
    if ((uVar1 >> 0x19 & 1) == 0) {
      uVar9 = uVar12;
    }
    uVar12 = uVar9 & 0xf6ffffff;
    if ((uVar1 >> 0x1b & 1) == 0) {
      uVar12 = uVar9;
    }
    uVar9 = uVar12 & 0xeeffffff;
    if ((uVar1 >> 0x1c & 1) == 0) {
      uVar9 = uVar12;
    }
    *(uint *)&mon_00->field_0x60 = uVar9;
  }
  mon_00->mxlth = 0;
  place_monster(mon_00,(int)x,(int)y);
  ppVar16 = mon_00->data;
  if ((ppVar16 == mons + 0x101 || (ppVar16 == mons + 0x21 || ppVar16 == mons + 0x20)) ||
      ppVar16->mlet == '\x19') {
LAB_001bbe65:
    plVar2 = mon_00->dlevel;
    x_00 = mon_00->mx;
    y_00 = mon_00->my;
    uVar9 = 1;
    if ((ppVar16 != mons + 0x101 && (ppVar16 != mons + 0x21 && ppVar16 != mons + 0x20)) &&
        ppVar16->mlet != '\x19') {
      pcVar10 = mons_mname(ppVar16);
      iVar8 = strcmp(pcVar10,"gold dragon");
      if (iVar8 != 0) {
        pcVar10 = mons_mname(mon_00->data);
        iVar8 = strcmp(pcVar10,"baby gold dragon");
        if ((iVar8 != 0) && (mon_00->data != mons + 0x73)) {
          uVar9 = (uint)(mon_00->data == mons + 0xa0);
        }
      }
    }
    new_light_source(plVar2,x_00,y_00,uVar9,1,mon_00);
  }
  else {
    pcVar10 = mons_mname(ppVar16);
    iVar8 = strcmp(pcVar10,"gold dragon");
    ppVar16 = mon_00->data;
    if (iVar8 == 0) goto LAB_001bbe65;
    pcVar10 = mons_mname(ppVar16);
    iVar8 = strcmp(pcVar10,"baby gold dragon");
    ppVar16 = mon_00->data;
    if ((iVar8 == 0) || (ppVar16 == mons + 0xa0 || ppVar16 == mons + 0x73)) goto LAB_001bbe65;
  }
  if (mon_00->mnamelth == '\0') {
    if ((mon->field_0x63 & 2) == 0) goto LAB_001bbf70;
    pcVar10 = shkname(mon);
  }
  else {
    mon_00->mnamelth = '\0';
    pcVar10 = (char *)((long)(mon->mtrack + 0x18) + (long)mon->mxlth);
  }
  mon_00 = christen_monst(mon_00,pcVar10);
LAB_001bbf70:
  if (flags.mon_moving == '\0') {
    if (mon->mtame == '\0') {
      if ((mon->field_0x62 & 0x40) != 0) {
        sVar14 = u.uluck;
        if (u.uluck < '\x01') {
          sVar14 = '\0';
        }
        uVar9 = mt_random();
        *(uint *)&mon_00->field_0x60 =
             *(uint *)&mon_00->field_0x60 & 0xffbfffff |
             (uint)(uVar9 % (uint)(byte)(sVar14 + 2) != 0) << 0x16;
      }
    }
    else {
      sVar14 = '\0';
      sVar7 = u.uluck;
      if (u.uluck < '\x01') {
        sVar7 = '\0';
      }
      uVar9 = mt_random();
      if (uVar9 % (uint)(byte)(sVar7 + 2) != 0) {
        sVar14 = mon->mtame;
      }
      mon_00->mtame = sVar14;
    }
  }
  newsym((int)mon_00->mx,(int)mon_00->my);
  if (mon_00->mtame != '\0') {
    if ((mon->field_0x63 & 4) == 0) {
      mon_00->mtame = '\0';
      pmVar11 = tamedog(mon_00,(obj *)0x0);
      if (pmVar11 != (monst *)0x0) {
        *(undefined4 *)((long)&pmVar11[1].minvent + 4) = *(undefined4 *)((long)&mon[1].minvent + 4);
        uVar3 = *(undefined8 *)&mon->field_0x74;
        uVar4 = *(undefined8 *)((long)&mon[1].nmon + 4);
        uVar5 = *(undefined8 *)((long)&mon[1].dlevel + 4);
        *(undefined8 *)((long)&pmVar11[1].data + 4) = *(undefined8 *)((long)&mon[1].data + 4);
        *(undefined8 *)((long)&pmVar11[1].dlevel + 4) = uVar5;
        *(undefined8 *)&pmVar11->field_0x74 = uVar3;
        *(undefined8 *)((long)&pmVar11[1].nmon + 4) = uVar4;
        mon_00 = pmVar11;
      }
    }
    else {
      mtmp2 = (monst *)calloc(1,(ulong)mon->mnamelth + 0x7e);
      pmVar11 = mon_00;
      pmVar17 = mtmp2;
      for (lVar13 = 0xf; lVar13 != 0; lVar13 = lVar13 + -1) {
        pmVar17->nmon = pmVar11->nmon;
        pmVar11 = (monst *)((long)pmVar11 + (ulong)bVar18 * -0x10 + 8);
        pmVar17 = (monst *)((long)pmVar17 + (ulong)bVar18 * -0x10 + 8);
      }
      mtmp2->mxtyp = '\x01';
      mtmp2->mxlth = 6;
      if (mon_00->mnamelth != '\0') {
        strcpy((char *)((long)&mtmp2[1].nmon + 2),
               (char *)((long)(mon_00->mtrack + 0x18) + (long)mon_00->mxlth));
      }
      *(undefined2 *)&mtmp2[1].nmon = *(undefined2 *)&mon[1].nmon;
      *(undefined4 *)&mtmp2->field_0x74 = *(undefined4 *)&mon->field_0x74;
      replmon(mon_00,mtmp2);
      mon_00 = mtmp2;
    }
  }
  set_malign(mon_00);
  return mon_00;
}

Assistant:

struct monst *clone_mon(struct monst *mon,
			xchar x, xchar y)/* clone's preferred location or 0 (near mon) */
{
	coord mm;
	struct monst *m2;

	/* may be too weak or have been extinguished for population control */
	if (mon->mhp <= 1 || (mvitals[monsndx(mon->data)].mvflags & G_EXTINCT))
	    return NULL;

	if (x == 0) {
	    mm.x = mon->mx;
	    mm.y = mon->my;
	    if (!enexto(&mm, level, mm.x, mm.y, mon->data) || MON_AT(level, mm.x, mm.y))
		return NULL;
	} else if (!isok(x, y)) {
	    return NULL;	/* paranoia */
	} else {
	    mm.x = x;
	    mm.y = y;
	    if (MON_AT(level, mm.x, mm.y)) {
		if (!enexto(&mm, level, mm.x, mm.y, mon->data) || MON_AT(level, mm.x, mm.y))
		    return NULL;
	    }
	}
	m2 = newmonst(MX_NONE, 0);
	*m2 = *mon;			/* copy condition of old monster */
	m2->nmon = level->monlist;
	level->monlist = m2;
	m2->m_id = flags.ident++;
	if (!m2->m_id) m2->m_id = flags.ident++;	/* ident overflowed */
	m2->mx = mm.x;
	m2->my = mm.y;

	m2->minvent = NULL; /* objects don't clone */
	m2->mleashed = FALSE;
	/* Max HP the same, but current HP halved for both.  The caller
	 * might want to override this by halving the max HP also.
	 * When current HP is odd, the original keeps the extra point.
	 */
	m2->mhpmax = mon->mhpmax;
	m2->mhp = mon->mhp / 2;
	mon->mhp -= m2->mhp;

	/* since shopkeepers and guards will only be cloned if they've been
	 * polymorphed away from their original forms, the clone doesn't have
	 * room for the extra information.  we also don't want two shopkeepers
	 * around for the same shop.
	 */
	if (mon->isshk) m2->isshk = FALSE;
	if (mon->isgd) m2->isgd = FALSE;
	if (mon->ispriest) m2->ispriest = FALSE;
	m2->mxlth = 0;
	place_monster(m2, m2->mx, m2->my);
	if (emits_light(m2->data))
	    new_light_source(m2->dlevel, m2->mx, m2->my, emits_light(m2->data),
			     LS_MONSTER, m2);
	if (m2->mnamelth) {
	    m2->mnamelth = 0; /* or it won't get allocated */
	    m2 = christen_monst(m2, NAME(mon));
	} else if (mon->isshk) {
	    m2 = christen_monst(m2, shkname(mon));
	}

	/* not all clones caused by player are tame or peaceful */
	if (!flags.mon_moving) {
	    if (mon->mtame)
		m2->mtame = rn2(max(2 + u.uluck, 2)) ? mon->mtame : 0;
	    else if (mon->mpeaceful)
		m2->mpeaceful = rn2(max(2 + u.uluck, 2)) ? 1 : 0;
	}

	newsym(m2->mx,m2->my);	/* display the new monster */
	if (m2->mtame) {
	    struct monst *m3;

	    if (mon->isminion) {
		m3 = newmonst(MX_EPRI, mon->mnamelth);
		*m3 = *m2;
		m3->mxtyp = MX_EPRI;
		m3->mxlth = sizeof(struct epri);
		if (m2->mnamelth) strcpy(NAME(m3), NAME(m2));
		*(EPRI(m3)) = *(EPRI(mon));
		replmon(m2, m3);
		m2 = m3;
	    } else {
		/* because m2 is a copy of mon it is tame but not init'ed.
		 * however, tamedog will not re-tame a tame dog, so m2
		 * must be made non-tame to get initialized properly.
		 */
		m2->mtame = 0;
		if ((m3 = tamedog(m2, NULL)) != 0) {
		    m2 = m3;
		    *(EDOG(m2)) = *(EDOG(mon));
		}
	    }
	}
	set_malign(m2);

	return m2;
}